

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add127_test.cc
# Opt level: O2

void intgemm::anon_unknown_0::TestMultiplyBiasNew<intgemm::AVX512VNNI::Kernels8>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  UnquantizeAndAddBiasAndWrite callback;
  UnquantizeAndAddBiasAndWrite callback_00;
  float fVar1;
  ostream *poVar2;
  char *pcVar3;
  float *pfVar4;
  long lVar5;
  char *pcVar6;
  IntermediateType sum;
  int iVar7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  Index k;
  ulong uVar12;
  float *pfVar13;
  ulong uVar14;
  ulong size;
  float *pfVar15;
  Index k_1;
  result_type_conflict rVar16;
  AlignedVector<float> B;
  AlignedVector<float> A;
  AlignedVector<float> bias;
  AlignedVector<float> test_C;
  param_type local_15f8;
  float local_15f0;
  float local_15ec;
  ulong local_15e8;
  AlignedVector<signed_char> B_prep;
  AlignedVector<float> float_C;
  AlignedVector<signed_char> A_prep2;
  AlignedVector<float> slowint_C;
  AlignedVector<signed_char> B_quant;
  AlignedVector<unsigned_char> A_prep;
  undefined4 uStack_157c;
  undefined4 uStack_1564;
  string local_1550;
  ostringstream info;
  mt19937 gen;
  
  local_15f0 = int_tolerance;
  local_15ec = float_tolerance;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&info);
  poVar2 = std::operator<<((ostream *)&info,"8-bit AVX512VNNI");
  poVar2 = std::operator<<(poVar2,"\t");
  local_15e8 = (ulong)A_rows;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,'\t');
  uVar14 = (ulong)width;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,'\t');
  size = (ulong)B_cols;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,'\n');
  AlignedVector<float>::AlignedVector(&A,(ulong)(width * A_rows),0x40);
  AlignedVector<float>::AlignedVector(&B,(ulong)(B_cols * width),0x40);
  AlignedVector<float>::AlignedVector(&bias,size,0x40);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&gen);
  pfVar4 = A.mem_;
  local_15f8._M_a = -1.0;
  local_15f8._M_b = 1.0;
  lVar8 = A.size_ << 2;
  for (lVar5 = 0; pfVar13 = B.mem_, lVar8 != lVar5; lVar5 = lVar5 + 4) {
    rVar16 = std::uniform_real_distribution<float>::operator()
                       ((uniform_real_distribution<float> *)&local_15f8,&gen);
    *(result_type_conflict *)((long)pfVar4 + lVar5) = rVar16;
  }
  lVar5 = CONCAT44(B.size_._4_4_,(Index)B.size_);
  for (lVar8 = 0; pfVar4 = bias.mem_, lVar5 << 2 != lVar8; lVar8 = lVar8 + 4) {
    rVar16 = std::uniform_real_distribution<float>::operator()
                       ((uniform_real_distribution<float> *)&local_15f8,&gen);
    *(result_type_conflict *)((long)pfVar13 + lVar8) = rVar16;
  }
  for (lVar5 = 0; bias.size_ << 2 != lVar5; lVar5 = lVar5 + 4) {
    rVar16 = std::uniform_real_distribution<float>::operator()
                       ((uniform_real_distribution<float> *)&local_15f8,&gen);
    *(result_type_conflict *)((long)pfVar4 + lVar5) = rVar16;
  }
  AlignedVector<unsigned_char>::AlignedVector(&A_prep,A.size_,0x40);
  AlignedVector<signed_char>::AlignedVector(&B_prep,CONCAT44(B.size_._4_4_,(Index)B.size_),0x40);
  AVX512BW::Kernels8::PrepareA(A.mem_,A_prep.mem_,63.5,A_rows,width);
  AVX512BW::Kernels8::PrepareB(B.mem_,B_prep.mem_,63.5,width,B_cols);
  AlignedVector<float>::AlignedVector(&test_C,(ulong)(B_cols * A_rows),0x40);
  AlignedVector<signed_char>::AlignedVector(&B_quant,CONCAT44(B.size_._4_4_,(Index)B.size_),0x40);
  AVX512BW::Kernels8::Quantize(B.mem_,B_quant.mem_,63.5,(Index)B.size_);
  AlignedVector<float>::AlignedVector(&slowint_C,test_C.size_,0x40);
  AlignedVector<signed_char>::AlignedVector(&A_prep2,A.size_,0x40);
  AVX512BW::Kernels8::PrepareA(A.mem_,A_prep2.mem_,63.5,A_rows,width);
  pcVar3 = A_prep2.mem_;
  for (uVar9 = 0; uVar9 != local_15e8; uVar9 = uVar9 + 1) {
    pcVar10 = B_quant.mem_;
    for (uVar11 = 0; uVar11 != size; uVar11 = uVar11 + 1) {
      iVar7 = 0;
      pcVar6 = pcVar10;
      for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
        iVar7 = iVar7 + (int)*pcVar6 * (int)pcVar3[uVar12];
        pcVar6 = pcVar6 + size;
      }
      slowint_C.mem_[uVar9 * size + uVar11] = (float)iVar7 * 0.0002480005 + bias.mem_[uVar11];
      pcVar10 = pcVar10 + 1;
    }
    pcVar3 = pcVar3 + uVar14;
  }
  AlignedVector<float>::AlignedVector(&float_C,test_C.size_,0x40);
  pfVar4 = A.mem_;
  for (uVar9 = 0; uVar9 != local_15e8; uVar9 = uVar9 + 1) {
    pfVar13 = B.mem_;
    for (uVar11 = 0; uVar11 != size; uVar11 = uVar11 + 1) {
      fVar1 = 0.0;
      pfVar15 = pfVar13;
      for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
        fVar1 = fVar1 + *pfVar15 * pfVar4[uVar12];
        pfVar15 = pfVar15 + size;
      }
      float_C.mem_[uVar9 * size + uVar11] = fVar1 + bias.mem_[uVar11];
      pfVar13 = pfVar13 + 1;
    }
    pfVar4 = pfVar4 + uVar14;
  }
  callback._4_4_ = uStack_1564;
  callback.unquant_mult = -0.031496063;
  callback.bias_addr = bias.mem_;
  callback.output_addr = bias.mem_;
  AVX512VNNI::Kernels8::PrepareBias<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (B_prep.mem_,width,B_cols,callback);
  callback_00._4_4_ = uStack_157c;
  callback_00.unquant_mult = 0.0002480005;
  callback_00.bias_addr = bias.mem_;
  callback_00.output_addr = test_C.mem_;
  AVX512VNNI::Kernels8::Multiply8Shift<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (A_prep.mem_,B_prep.mem_,A_rows,width,B_cols,callback_00);
  pfVar15 = slowint_C.mem_;
  pfVar13 = float_C.mem_;
  pfVar4 = test_C.mem_;
  std::__cxx11::stringbuf::str();
  CompareMSE(pfVar13,pfVar15,pfVar4,test_C.size_,&local_1550,0.0001,local_15f0,local_15ec,0.001);
  std::__cxx11::string::~string((string *)&local_1550);
  free(float_C.mem_);
  free(A_prep2.mem_);
  free(slowint_C.mem_);
  free(B_quant.mem_);
  free(test_C.mem_);
  free(B_prep.mem_);
  free(A_prep.mem_);
  free(bias.mem_);
  free(B.mem_);
  free(A.mem_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&info);
  return;
}

Assistant:

void TestMultiplyBiasNew(Index A_rows, Index width, Index B_cols,
 float int_tolerance=.1, float float_tolerance=1, float MSE_float_tolerance=0, float MSE_int_tolerance=0) {
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = dist(gen);
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<uint8_t> A_prep(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  /*REFERENCE MULTIPLICATION
  *
  *
  */
  AlignedVector<int8_t> B_quant(B.size());
  Routine::Quantize(B.begin(), B_quant.begin(), quant_mult, static_cast<Index>(B.size()));
  AlignedVector<float> slowint_C(test_C.size());
  // Taking the original A_preparation which means A would be int8_t
  AlignedVector<int8_t> A_prep2(A.size());
  Routine::PrepareA(A.begin(), A_prep2.begin(), quant_mult, A_rows, width);
  references::Multiply(A_prep2.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return sum * unquant_mult + bias[info.col_idx];
  });

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return static_cast<float>(sum) + bias[info.col_idx];
  });

  /*ACTUAL MULTIPLICATION
  *
  */
  float unquant_mult_forprep = (-1.0f)*(alpha)*(alpha)/(127.0f); //Minus one to invert add_ps later on
  Routine::PrepareBias(B_prep.begin(), width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult_forprep, bias.begin(), bias.begin()));
  //Routine::PrepareBias(B.begin(), bias.begin(), alpha, width, B_cols);
  Routine::Multiply8Shift(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), test_C.begin()));

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}